

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Factory.cpp
# Opt level: O2

DataViewPtr __thiscall
Rml::Factory::InstanceDataView
          (Factory *this,String *type_name,Element *element,bool is_structural_view)

{
  code *pcVar1;
  bool bVar2;
  FactoryData *pFVar3;
  iterator iVar4;
  iterator iVar5;
  
  if ((element == (Element *)0x0) &&
     (bVar2 = Assert("RMLUI_ASSERT(element)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Factory.cpp"
                     ,0x265), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  pFVar3 = ControlledLifetimeResource<Rml::FactoryData>::operator->
                     ((ControlledLifetimeResource<Rml::FactoryData> *)factory_data);
  if (is_structural_view) {
    iVar4 = itlib::
            flat_map<std::__cxx11::string,Rml::DataViewInstancer*,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::DataViewInstancer*>,std::allocator<std::pair<std::__cxx11::string,Rml::DataViewInstancer*>>>>
            ::find<std::__cxx11::string>
                      ((flat_map<std::__cxx11::string,Rml::DataViewInstancer*,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::DataViewInstancer*>,std::allocator<std::pair<std::__cxx11::string,Rml::DataViewInstancer*>>>>
                        *)&pFVar3->structural_data_view_instancers,type_name);
    pFVar3 = ControlledLifetimeResource<Rml::FactoryData>::operator->
                       ((ControlledLifetimeResource<Rml::FactoryData> *)factory_data);
    if (iVar4._M_current ==
        (pFVar3->structural_data_view_instancers).m_container.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_002a096e:
      *(undefined8 *)this = 0;
      return (__uniq_ptr_data<Rml::DataView,_Rml::Releaser<Rml::DataView>,_true,_true>)
             (__uniq_ptr_data<Rml::DataView,_Rml::Releaser<Rml::DataView>,_true,_true>)this;
    }
  }
  else {
    iVar5 = robin_hood::detail::
            Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&pFVar3->data_view_instancers,type_name);
    iVar4._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*>
          *)iVar5.mKeyVals;
    pFVar3 = ControlledLifetimeResource<Rml::FactoryData>::operator->
                       ((ControlledLifetimeResource<Rml::FactoryData> *)factory_data);
    if (iVar4._M_current ==
        (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*>
         *)(pFVar3->data_view_instancers).mInfo) goto LAB_002a096e;
  }
  (*(iVar4._M_current)->second->_vptr_DataViewInstancer[2])(this,(iVar4._M_current)->second,element)
  ;
  return (__uniq_ptr_data<Rml::DataView,_Rml::Releaser<Rml::DataView>,_true,_true>)
         (__uniq_ptr_data<Rml::DataView,_Rml::Releaser<Rml::DataView>,_true,_true>)this;
}

Assistant:

DataViewPtr Factory::InstanceDataView(const String& type_name, Element* element, bool is_structural_view)
{
	RMLUI_ASSERT(element);

	if (is_structural_view)
	{
		auto it = factory_data->structural_data_view_instancers.find(type_name);
		if (it != factory_data->structural_data_view_instancers.end())
			return it->second->InstanceView(element);
	}
	else
	{
		auto it = factory_data->data_view_instancers.find(type_name);
		if (it != factory_data->data_view_instancers.end())
			return it->second->InstanceView(element);
	}
	return nullptr;
}